

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetInt(ImGuiStorage *this,ImGuiID key,int val)

{
  const_iterator it_00;
  iterator pvVar1;
  iterator pvVar2;
  Pair local_30;
  const_iterator local_20;
  iterator it;
  int val_local;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it._0_4_ = val;
  it._4_4_ = key;
  _val_local = this;
  pvVar1 = LowerBound(&this->Data,key);
  local_20 = pvVar1;
  pvVar2 = ImVector<ImGuiStorage::Pair>::end(&this->Data);
  it_00 = local_20;
  if ((pvVar1 == pvVar2) || (local_20->key != it._4_4_)) {
    Pair::Pair(&local_30,it._4_4_,(int)it);
    ImVector<ImGuiStorage::Pair>::insert(&this->Data,it_00,&local_30);
  }
  else {
    (local_20->field_1).val_i = (int)it;
  }
  return;
}

Assistant:

void ImGuiStorage::SetInt(ImGuiID key, int val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_i = val;
}